

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  ImVec2 IVar5;
  
  pIVar3 = GImGui;
  FocusWindow(window,0);
  SetActiveID(window->MoveId,window);
  pIVar3->NavDisableHighlight = true;
  IVar1 = (pIVar3->IO).MouseClickedPos[0];
  IVar2 = window->RootWindow->Pos;
  IVar5.x = IVar1.x - IVar2.x;
  IVar5.y = IVar1.y - IVar2.y;
  pIVar3->ActiveIdClickOffset = IVar5;
  pIVar3->ActiveIdNoClearOnFocusLoss = true;
  pIVar4 = GImGui;
  GImGui->ActiveIdUsingNavDirMask = 0xf;
  pIVar4->ActiveIdUsingAllKeyboardKeys = true;
  pIVar4->NavMoveSubmitted = false;
  pIVar4->NavMoveScoringItems = false;
  pIVar4->NavAnyRequest = pIVar4->NavInitRequest;
  if (((window->Flags & 4) == 0) && ((window->RootWindow->Flags & 4) == 0)) {
    pIVar3->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindow->Pos;
    g.ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingAllKeyboardKeys();

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}